

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void anon_unknown.dwarf_1e8795::writeFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo,
               Compression pCompression)

{
  uint pNbChannels;
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  ChannelList *pCVar4;
  size_t sVar5;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  undefined1 in_R10B;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  undefined8 *puVar9;
  undefined **ppuVar10;
  int pWidth_local;
  int pHeight_local;
  undefined **local_150;
  StringVector multiView;
  Slice local_120;
  OutputFile lFile;
  FrameBuffer lOutputFrameBuffer;
  Array2D<half> lPixels;
  Header header;
  Array2D<half> lPixelsLeft;
  
  pNbChannels = *(uint *)("\t\tRGBA file to RGBA framebuffer" + (long)(int)pImageType * 4 + 0x1d);
  uVar8 = (ulong)pNbChannels;
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  Imf_2_5::Array2D<half>::resizeErase(&lPixels,(long)pHeight,(long)(int)(pNbChannels * pWidth));
  fillPixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    Imf_2_5::Array2D<half>::resizeErase
              (&lPixelsLeft,(long)pHeight,(long)(int)(pNbChannels * pWidth));
    fillPixels(&pHeight_local,&pWidth_local,&lPixelsLeft,pNbChannels,true);
    local_120.type = UINT;
    local_120._4_4_ = 0;
    Imf_2_5::Header::Header
              (&header,pWidth,pHeight,1.0,(V2f *)&local_120,1.0,INCREASING_Y,pCompression);
    puVar9 = &(anonymous_namespace)::CHANNEL_NAMES;
    local_150 = &(anonymous_namespace)::CHANNEL_NAMES_LEFT;
    for (lVar6 = 0; uVar8 * 8 != lVar6; lVar6 = lVar6 + 8) {
      pCVar4 = Imf_2_5::Header::channels(&header);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar6);
      Imf_2_5::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar4,pcVar1,(Channel *)&local_120);
      pCVar4 = Imf_2_5::Header::channels(&header);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar6);
      Imf_2_5::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar4,pcVar1,(Channel *)&local_120);
    }
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"right",(allocator<char> *)&lOutputFrameBuffer);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"left",(allocator<char> *)&lOutputFrameBuffer);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    Imf_2_5::
    TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_120,&multiView);
    Imf_2_5::Header::insert(&header,"multiView",(Attribute *)&local_120);
    Imf_2_5::
    TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_120);
    iVar3 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile(&lFile,pFilename,&header,iVar3);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sVar2 = uVar8 * 2;
    sVar5 = sVar2;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 2) {
      pcVar1 = (char *)*puVar9;
      Imf_2_5::Slice::Slice
                (&local_120,HALF,(char *)((long)&(lPixels._data)->_h + sVar7),sVar2,
                 (long)pWidth * sVar2,1,1,0.0,(bool)in_R10B,SUB81(sVar5,0));
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,&local_120);
      pcVar1 = *local_150;
      Imf_2_5::Slice::Slice
                (&local_120,HALF,(char *)((long)&(lPixelsLeft._data)->_h + sVar7),sVar2,
                 (long)pWidth * sVar2,1,1,0.0,(bool)in_R10B,SUB81(local_150,0));
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,&local_120);
      local_150 = local_150 + 1;
      puVar9 = puVar9 + 1;
      sVar5 = extraout_RAX_00;
    }
    Imf_2_5::OutputFile::setFrameBuffer(&lFile,&lOutputFrameBuffer);
    Imf_2_5::OutputFile::writePixels(&lFile,pHeight);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_2_5::OutputFile::~OutputFile(&lFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&multiView);
    Imf_2_5::Header::~Header(&header);
    Imf_2_5::Array2D<half>::~Array2D(&lPixelsLeft);
  }
  else {
    local_120.type = UINT;
    local_120._4_4_ = 0;
    Imf_2_5::Header::Header
              (&header,pWidth,pHeight,1.0,(V2f *)&local_120,1.0,INCREASING_Y,pCompression);
    local_150 = (undefined **)(uVar8 * 8);
    puVar9 = &(anonymous_namespace)::CHANNEL_NAMES;
    for (ppuVar10 = (undefined **)0x0; local_150 != ppuVar10; ppuVar10 = ppuVar10 + 1) {
      pCVar4 = Imf_2_5::Header::channels(&header);
      pcVar1 = ppuVar10[0x84074];
      Imf_2_5::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar4,pcVar1,(Channel *)&local_120);
    }
    iVar3 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile((OutputFile *)&multiView,pFilename,&header,iVar3);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sVar2 = uVar8 * 2;
    sVar5 = sVar2;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 2) {
      pcVar1 = (char *)*puVar9;
      Imf_2_5::Slice::Slice
                (&local_120,HALF,(char *)((long)&(lPixels._data)->_h + sVar7),sVar2,
                 (long)pWidth * sVar2,1,1,0.0,(bool)in_R10B,SUB81(sVar5,0));
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,&local_120);
      puVar9 = puVar9 + 1;
      sVar5 = extraout_RAX;
    }
    Imf_2_5::OutputFile::setFrameBuffer((OutputFile *)&multiView,&lOutputFrameBuffer);
    Imf_2_5::OutputFile::writePixels((OutputFile *)&multiView,pHeight);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_2_5::OutputFile::~OutputFile((OutputFile *)&multiView);
    Imf_2_5::Header::~Header(&header);
  }
  Imf_2_5::Array2D<half>::~Array2D(&lPixels);
  return;
}

Assistant:

void
writeFile (const char pFilename[],
           int pHeight,
           int pWidth,
           EImageType pImageType,
           bool pIsStereo,
           Compression pCompression)
{
    const int lNbChannels = getNbChannels (pImageType);
    Array2D<half> lPixels;

    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    fillPixels (pHeight, pWidth, lPixels, lNbChannels, false);

    if(pIsStereo)
    {
        Array2D<half> lPixelsLeft;

        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        fillPixels (pHeight,
                    pWidth,
                    lPixelsLeft,
                    lNbChannels,
                    true);

        writePixels (pFilename,
                     pHeight,
                     pWidth,
                     lPixels,
                     lPixelsLeft,
                     lNbChannels,
                     pCompression);
    }
    else
    {
        writePixels (pFilename,
                    pHeight,
                    pWidth,
                    lPixels,
                    lNbChannels,
                    pCompression);
    }
}